

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::ConsoleReporter::file_line_to_stream
          (ConsoleReporter *this,char *file,int line,char *tail)

{
  ostream *poVar1;
  char *pcVar2;
  int local_54;
  char *local_48;
  char *tail_local;
  int line_local;
  char *file_local;
  ConsoleReporter *this_local;
  
  poVar1 = Color::operator<<(this->s,LightGrey);
  pcVar2 = skipPathFromFilename(file);
  poVar1 = std::operator<<(poVar1,pcVar2);
  if ((this->opt->gnu_file_line & 1U) == 0) {
    local_48 = "(";
  }
  else {
    local_48 = ":";
  }
  poVar1 = std::operator<<(poVar1,local_48);
  local_54 = line;
  if ((this->opt->no_line_numbers & 1U) != 0) {
    local_54 = 0;
  }
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_54);
  pcVar2 = "):";
  if ((this->opt->gnu_file_line & 1U) != 0) {
    pcVar2 = ":";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,tail);
  return;
}

Assistant:

virtual void file_line_to_stream(const char* file, int line,
                                        const char* tail = "") {
            s << Color::LightGrey << skipPathFromFilename(file) << (opt.gnu_file_line ? ":" : "(")
            << (opt.no_line_numbers ? 0 : line) // 0 or the real num depending on the option
            << (opt.gnu_file_line ? ":" : "):") << tail;
        }